

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int Curl_ossl_init(void)

{
  int iVar1;
  uint uVar2;
  char *__filename;
  
  OPENSSL_load_builtin_modules();
  ENGINE_load_builtin_engines();
  uVar2 = 0;
  CONF_modules_load_file((char *)0x0,(char *)0x0,0x30);
  if (keylog_file_fp == (FILE *)0x0) {
    __filename = curl_getenv("SSLKEYLOGFILE");
    if (__filename != (char *)0x0) {
      keylog_file_fp = (FILE *)fopen64(__filename,"a");
      if ((FILE *)keylog_file_fp != (FILE *)0x0) {
        iVar1 = setvbuf((FILE *)keylog_file_fp,(char *)0x0,1,0x1000);
        if (iVar1 != 0) {
          fclose((FILE *)keylog_file_fp);
          keylog_file_fp = (FILE *)0x0;
        }
      }
      (*Curl_cfree)(__filename);
    }
  }
  iVar1 = ossl_get_ssl_conn_index();
  if (-1 < iVar1) {
    uVar2 = ossl_get_ssl_sockindex_index();
    uVar2 = ~uVar2 >> 0x1f;
  }
  return uVar2;
}

Assistant:

static int Curl_ossl_init(void)
{
#ifdef ENABLE_SSLKEYLOGFILE
  char *keylog_file_name;
#endif

  OPENSSL_load_builtin_modules();

#ifdef USE_OPENSSL_ENGINE
  ENGINE_load_builtin_engines();
#endif

  /* OPENSSL_config(NULL); is "strongly recommended" to use but unfortunately
     that function makes an exit() call on wrongly formatted config files
     which makes it hard to use in some situations. OPENSSL_config() itself
     calls CONF_modules_load_file() and we use that instead and we ignore
     its return code! */

  /* CONF_MFLAGS_DEFAULT_SECTION introduced some time between 0.9.8b and
     0.9.8e */
#ifndef CONF_MFLAGS_DEFAULT_SECTION
#define CONF_MFLAGS_DEFAULT_SECTION 0x0
#endif

#ifndef CURL_DISABLE_OPENSSL_AUTO_LOAD_CONFIG
  CONF_modules_load_file(NULL, NULL,
                         CONF_MFLAGS_DEFAULT_SECTION|
                         CONF_MFLAGS_IGNORE_MISSING_FILE);
#endif

#if (OPENSSL_VERSION_NUMBER >= 0x10100000L) && \
    !defined(LIBRESSL_VERSION_NUMBER)
  /* OpenSSL 1.1.0+ takes care of initialization itself */
#else
  /* Lets get nice error messages */
  SSL_load_error_strings();

  /* Init the global ciphers and digests */
  if(!SSLeay_add_ssl_algorithms())
    return 0;

  OpenSSL_add_all_algorithms();
#endif

#ifdef ENABLE_SSLKEYLOGFILE
  if(!keylog_file_fp) {
    keylog_file_name = curl_getenv("SSLKEYLOGFILE");
    if(keylog_file_name) {
      keylog_file_fp = fopen(keylog_file_name, FOPEN_APPENDTEXT);
      if(keylog_file_fp) {
#ifdef WIN32
        if(setvbuf(keylog_file_fp, NULL, _IONBF, 0))
#else
        if(setvbuf(keylog_file_fp, NULL, _IOLBF, 4096))
#endif
        {
          fclose(keylog_file_fp);
          keylog_file_fp = NULL;
        }
      }
      Curl_safefree(keylog_file_name);
    }
  }
#endif

  /* Initialize the extra data indexes */
  if(ossl_get_ssl_conn_index() < 0 || ossl_get_ssl_sockindex_index() < 0)
    return 0;

  return 1;
}